

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_MonsterRefire
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *this;
  int iVar2;
  MetaClass *cls;
  FState *val;
  AActor *pAVar3;
  bool bVar4;
  bool local_6b;
  FState *state_2;
  FState *state_1;
  FState *state;
  FState *jump;
  int prob;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123a,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123a,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_6b = true;
  if (this != (AActor *)0x0) {
    local_6b = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_6b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123a,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123b,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type == '\0') {
    iVar1 = param[1].field_0.i;
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x123c,
                    "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x123c,
                    "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = param[2].field_0.i;
    cls = AActor::GetClass(this);
    val = FStateLabelStorage::GetState(&StateLabels,iVar2,cls,false);
    A_FaceTarget(this);
    iVar2 = FRandom::operator()(&pr_monsterrefire);
    if (iVar2 < iVar1) {
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1242,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,(void *)0x0,0);
        param_local._4_4_ = 1;
      }
    }
    else {
      bVar4 = TObjPtr<AActor>::operator==(&this->target,(AActor *)0x0);
      if (((!bVar4) && (bVar4 = P_HitFriend(this), !bVar4)) &&
         (pAVar3 = TObjPtr<AActor>::operator->(&this->target), 0 < pAVar3->health)) {
        pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
        bVar4 = P_CheckSight(this,pAVar3,6);
        if (bVar4) {
          if (numret < 1) {
            return 0;
          }
          if (ret != (VMReturn *)0x0) {
            VMReturn::SetPointer(ret,(void *)0x0,0);
            return 1;
          }
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x124b,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1249,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,val,0);
        param_local._4_4_ = 1;
      }
    }
    return param_local._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x123b,
                "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MonsterRefire)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT	(prob);
	PARAM_STATE	(jump);

	A_FaceTarget(self);

	if (pr_monsterrefire() < prob)
	{
		ACTION_RETURN_STATE(NULL);
	}
	if (self->target == NULL
		|| P_HitFriend (self)
		|| self->target->health <= 0
		|| !P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING|SF_SEEPASTSHOOTABLELINES) )
	{
		ACTION_RETURN_STATE(jump);
	}
	ACTION_RETURN_STATE(NULL);
}